

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindExtensionByNumber
          (DescriptorPool *this,Descriptor *extendee,int number)

{
  pthread_mutex_t *__mutex;
  bool bVar1;
  FieldDescriptor *pFVar2;
  Mutex *mu;
  ReaderMutexLock lock_1;
  MutexLockMaybe lock;
  MutexLockMaybe local_30;
  
  if (*(int *)(extendee + 0x78) == 0) {
    return (FieldDescriptor *)0x0;
  }
  __mutex = (pthread_mutex_t *)this->mutex_;
  if (__mutex == (pthread_mutex_t *)0x0) {
    mu = (Mutex *)0x0;
  }
  else {
    std::mutex::lock((mutex *)&__mutex->__data);
    pFVar2 = Tables::FindExtension
                       ((this->tables_)._M_t.
                        super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                        .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                        _M_head_impl,extendee,number);
    pthread_mutex_unlock(__mutex);
    if (pFVar2 != (FieldDescriptor *)0x0) {
      return pFVar2;
    }
    mu = this->mutex_;
  }
  internal::MutexLockMaybe::MutexLockMaybe(&local_30,mu);
  if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(((this->tables_)._M_t.
               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
              _M_head_impl)->known_bad_symbols_)._M_h);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::clear(&(((this->tables_)._M_t.
               super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
              _M_head_impl)->known_bad_files_)._M_h);
  }
  pFVar2 = Tables::FindExtension
                     ((this->tables_)._M_t.
                      super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                      .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                      _M_head_impl,extendee,number);
  if (((pFVar2 == (FieldDescriptor *)0x0) &&
      ((this->underlay_ == (DescriptorPool *)0x0 ||
       (pFVar2 = FindExtensionByNumber(this->underlay_,extendee,number),
       pFVar2 == (FieldDescriptor *)0x0)))) &&
     ((bVar1 = TryFindExtensionInFallbackDatabase(this,extendee,number), !bVar1 ||
      (pFVar2 = Tables::FindExtension
                          ((this->tables_)._M_t.
                           super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                           .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                           ._M_head_impl,extendee,number), pFVar2 == (FieldDescriptor *)0x0)))) {
    pFVar2 = (FieldDescriptor *)0x0;
  }
  internal::MutexLockMaybe::~MutexLockMaybe(&local_30);
  return pFVar2;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindExtensionByNumber(
    const Descriptor* extendee, int number) const {
  if (extendee->extension_range_count() == 0) return nullptr;
  // A faster path to reduce lock contention in finding extensions, assuming
  // most extensions will be cache hit.
  if (mutex_ != nullptr) {
    ReaderMutexLock lock(mutex_);
    const FieldDescriptor* result = tables_->FindExtension(extendee, number);
    if (result != nullptr) {
      return result;
    }
  }
  MutexLockMaybe lock(mutex_);
  if (fallback_database_ != nullptr) {
    tables_->known_bad_symbols_.clear();
    tables_->known_bad_files_.clear();
  }
  const FieldDescriptor* result = tables_->FindExtension(extendee, number);
  if (result != nullptr) {
    return result;
  }
  if (underlay_ != nullptr) {
    result = underlay_->FindExtensionByNumber(extendee, number);
    if (result != nullptr) return result;
  }
  if (TryFindExtensionInFallbackDatabase(extendee, number)) {
    result = tables_->FindExtension(extendee, number);
    if (result != nullptr) {
      return result;
    }
  }
  return nullptr;
}